

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O1

GLenum __thiscall
glcts::DrawBuffersIndexedColorMasks::ReadableType(DrawBuffersIndexedColorMasks *this,GLenum format)

{
  uint uVar1;
  ulong uVar2;
  
  if ((int)format < 0x8d62) {
    uVar1 = format - 0x8229;
    if (uVar1 < 0x14) {
      if ((0x55500U >> (uVar1 & 0x1f) & 1) != 0) {
        return 0x1404;
      }
      if ((0xaaa00U >> (uVar1 & 0x1f) & 1) != 0) {
        return 0x1405;
      }
      if ((5U >> (uVar1 & 0x1f) & 1) != 0) {
        return 0x1401;
      }
    }
    if ((format - 0x8051 < 9) && ((0x1e1U >> (format - 0x8051 & 0x1f) & 1) != 0)) {
      return 0x1401;
    }
  }
  else {
    uVar2 = (ulong)(format - 0x8d62);
    if (format - 0x8d62 < 0x2d) {
      if ((0x4104000UL >> (uVar2 & 0x3f) & 1) != 0) {
        return 0x1405;
      }
      if ((0x104100000000U >> (uVar2 & 0x3f) & 1) != 0) {
        return 0x1404;
      }
      if (uVar2 == 0) {
        return 0x1401;
      }
    }
    if (format == 0x906f) {
      return 0x1405;
    }
  }
  return 0;
}

Assistant:

glw::GLenum DrawBuffersIndexedColorMasks::ReadableType(glw::GLenum format)
{
	switch (format)
	{
	case GL_R8:
	case GL_RG8:
	case GL_RGB8:
	case GL_RGB565:
	case GL_RGBA4:
	case GL_RGB5_A1:
	case GL_RGBA8:
	case GL_RGB10_A2:
		return GL_UNSIGNED_BYTE;

	case GL_R8I:
	case GL_R16I:
	case GL_R32I:
	case GL_RG8I:
	case GL_RG16I:
	case GL_RG32I:
	case GL_RGBA8I:
	case GL_RGBA16I:
	case GL_RGBA32I:
		return GL_INT;

	case GL_R8UI:
	case GL_R16UI:
	case GL_R32UI:
	case GL_RG8UI:
	case GL_RG16UI:
	case GL_RG32UI:
	case GL_RGB10_A2UI:
	case GL_RGBA8UI:
	case GL_RGBA16UI:
	case GL_RGBA32UI:
		return GL_UNSIGNED_INT;

	default:
		return 0;
	}
}